

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O0

double __thiscall GenCADFile::get_padstack_radius(GenCADFile *this,mpc_ast_t *padstack_ast)

{
  GenCADFile *this_00;
  undefined8 in_RDI;
  double pad_radius;
  mpc_ast_t *pad_ast;
  char *pad_name;
  mpc_ast_t *pad_ref_ast;
  mpc_ast_t *in_stack_00000028;
  int i;
  double radius;
  char *in_stack_ffffffffffffffc0;
  mpc_ast_t *in_stack_ffffffffffffffc8;
  mpc_ast_t *in_stack_ffffffffffffffd0;
  int local_1c;
  char *local_18;
  
  local_18 = (char *)0x3fe0000000000000;
  local_1c = 0;
  while (-1 < local_1c) {
    local_1c = mpc_ast_get_index_lb
                         (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                          (int)((ulong)in_RDI >> 0x20));
    if ((-1 < local_1c) &&
       (this_00 = (GenCADFile *)
                  mpc_ast_get_child_lb
                            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                             (int)((ulong)in_RDI >> 0x20)), this_00 != (GenCADFile *)0x0)) {
      in_stack_ffffffffffffffd0 =
           (mpc_ast_t *)
           get_nonquoted_or_quoted_string_child
                     (this_00,in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
      if ((in_stack_ffffffffffffffd0 != (mpc_ast_t *)0x0) &&
         ((in_stack_ffffffffffffffc8 = get_pad_by_name(this_00,(char *)in_stack_ffffffffffffffd0),
          in_stack_ffffffffffffffc8 != (mpc_ast_t *)0x0 &&
          (in_stack_ffffffffffffffc0 =
                (char *)get_pad_radius((GenCADFile *)radius,in_stack_00000028),
          (double)local_18 < (double)in_stack_ffffffffffffffc0)))) {
        local_18 = in_stack_ffffffffffffffc0;
      }
      local_1c = local_1c + 1;
    }
  }
  return (double)local_18;
}

Assistant:

double GenCADFile::get_padstack_radius(mpc_ast_t *padstack_ast) {
	double radius = 0.5;
	// loop through all pads in a padstack and return with the greatest size
	for (int i = 0; i >= 0;) {
		i = mpc_ast_get_index_lb(padstack_ast, "padstacks_pad|>", i);
		if (i >= 0) {
			mpc_ast_t *pad_ref_ast = mpc_ast_get_child_lb(padstack_ast, "padstacks_pad|>", i);
			if (!pad_ref_ast) continue;

			char *pad_name = get_nonquoted_or_quoted_string_child(pad_ref_ast, "pad_name");
			if (pad_name) {
				mpc_ast_t *pad_ast = get_pad_by_name(pad_name);
				if (pad_ast != nullptr) {
					double pad_radius  = get_pad_radius(pad_ast);
					if (pad_radius > radius) radius = pad_radius;
				}
			}
			i++;
		}
	}
	return radius;
}